

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

SeatPromptResult *
console_confirm_ssh_host_key
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *host,int port,char *keytype,
          char *keystr,SeatDialogText *text,HelpCtx helpctx,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  SeatDialogTextType SVar1;
  SeatDialogTextItem *pSVar2;
  ptrlen input;
  SeatDialogTextItem *end_1;
  SeatDialogTextItem *item_1;
  termios newmode;
  termios oldmode;
  SeatDialogTextItem *end;
  SeatDialogTextItem *item;
  stdio_sink errsink [1];
  char *local_a0;
  char *prompt;
  termios cf;
  char line [32];
  char *keystr_local;
  char *keytype_local;
  int port_local;
  char *host_local;
  Seat *seat_local;
  
  stdio_sink_init((stdio_sink *)&item,(FILE *)_stderr);
  premsg((termios *)((long)&prompt + 4));
  end = text->items;
  pSVar2 = end + text->nitems;
  do {
    if (pSVar2 <= end) {
      while( true ) {
        fprintf(_stderr,"%s (y/n, Return cancels connection, i for more info) ",local_a0);
        fflush(_stderr);
        tcgetattr(0,(termios *)&newmode.c_ispeed);
        memcpy(&item_1,&newmode.c_ispeed,0x3c);
        newmode.c_oflag = newmode.c_oflag | 0xb;
        tcsetattr(0,0,(termios *)&item_1);
        cf.c_ispeed._0_1_ = '\0';
        block_and_read(0,&cf.c_ispeed,0x1f);
        tcsetattr(0,0,(termios *)&newmode.c_ispeed);
        if (((char)cf.c_ispeed != 'i') && ((char)cf.c_ispeed != 'I')) break;
        end_1 = text->items;
        pSVar2 = end_1 + text->nitems;
        for (; end_1 < pSVar2; end_1 = end_1 + 1) {
          SVar1 = end_1->type;
          if (SVar1 == SDT_MORE_INFO_KEY) {
            fprintf(_stderr,"%s",end_1->text);
          }
          else if (SVar1 == SDT_MORE_INFO_VALUE_SHORT) {
            fprintf(_stderr,": %s\n",end_1->text);
          }
          else if (SVar1 == SDT_MORE_INFO_VALUE_BLOB) {
            fprintf(_stderr,":\n%s\n",end_1->text);
          }
        }
      }
      if ((((char)cf.c_ispeed == '\0') ||
          ((((char)cf.c_ispeed == '\r' || ((char)cf.c_ispeed == '\n')) || ((char)cf.c_ispeed == 'q')
           ))) || ((char)cf.c_ispeed == 'Q')) {
        fputs("Connection abandoned.\n",_stderr);
        postmsg((termios *)((long)&prompt + 4));
        make_spr_simple(__return_storage_ptr__,SPRK_USER_ABORT);
      }
      else {
        if (((char)cf.c_ispeed == 'y') || ((char)cf.c_ispeed == 'Y')) {
          store_host_key(host,port,keytype,keystr);
        }
        postmsg((termios *)((long)&prompt + 4));
        make_spr_simple(__return_storage_ptr__,SPRK_OK);
      }
      return __return_storage_ptr__;
    }
    switch(end->type) {
    case SDT_PARA:
      input = ptrlen_from_asciz(end->text);
      wordwrap((BinarySink *)errsink,input,0x3c);
      fputc(10,_stderr);
      break;
    case SDT_DISPLAY:
      fprintf(_stderr,"  %s\n",end->text);
      break;
    case SDT_SCARY_HEADING:
      fprintf(_stderr,"%s\n",end->text);
      break;
    default:
      break;
    case SDT_PROMPT:
      local_a0 = end->text;
      break;
    case SDT_BATCH_ABORT:
      if ((console_batch_mode & 1U) != 0) {
        fprintf(_stderr,"%s\n",end->text);
        fflush(_stderr);
        postmsg((termios *)((long)&prompt + 4));
        make_spr_sw_abort_static(__return_storage_ptr__,"Cannot confirm a host key in batch mode");
        return __return_storage_ptr__;
      }
    }
    end = end + 1;
  } while( true );
}

Assistant:

SeatPromptResult console_confirm_ssh_host_key(
    Seat *seat, const char *host, int port, const char *keytype,
    char *keystr, SeatDialogText *text, HelpCtx helpctx,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    char line[32];
    struct termios cf;
    const char *prompt;

    stdio_sink errsink[1];
    stdio_sink_init(errsink, stderr);

    premsg(&cf);

    for (SeatDialogTextItem *item = text->items,
             *end = item+text->nitems; item < end; item++) {
        switch (item->type) {
          case SDT_PARA:
            wordwrap(BinarySink_UPCAST(errsink),
                     ptrlen_from_asciz(item->text), 60);
            fputc('\n', stderr);
            break;
          case SDT_DISPLAY:
            fprintf(stderr, "  %s\n", item->text);
            break;
          case SDT_SCARY_HEADING:
            /* Can't change font size or weight in this context */
            fprintf(stderr, "%s\n", item->text);
            break;
          case SDT_BATCH_ABORT:
            if (console_batch_mode) {
                fprintf(stderr, "%s\n", item->text);
                fflush(stderr);
                postmsg(&cf);
                return SPR_SW_ABORT("Cannot confirm a host key in batch mode");
            }
            break;
          case SDT_PROMPT:
            prompt = item->text;
            break;
          default:
            break;
        }
    }

    while (true) {
        fprintf(stderr,
                "%s (y/n, Return cancels connection, i for more info) ",
                prompt);
        fflush(stderr);

        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);

        if (line[0] == 'i' || line[0] == 'I') {
            for (SeatDialogTextItem *item = text->items,
                     *end = item+text->nitems; item < end; item++) {
                switch (item->type) {
                  case SDT_MORE_INFO_KEY:
                    fprintf(stderr, "%s", item->text);
                    break;
                  case SDT_MORE_INFO_VALUE_SHORT:
                    fprintf(stderr, ": %s\n", item->text);
                    break;
                  case SDT_MORE_INFO_VALUE_BLOB:
                    fprintf(stderr, ":\n%s\n", item->text);
                    break;
                  default:
                    break;
                }
            }
        } else {
            break;
        }
    }

    /* In case of misplaced reflexes from another program, also recognise 'q'
     * as 'abandon connection rather than trust this key' */
    if (line[0] != '\0' && line[0] != '\r' && line[0] != '\n' &&
        line[0] != 'q' && line[0] != 'Q') {
        if (line[0] == 'y' || line[0] == 'Y')
            store_host_key(host, port, keytype, keystr);
        postmsg(&cf);
        return SPR_OK;
    } else {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_USER_ABORT;
    }
}